

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::ConditionalExpr::handle_name_abi_cxx11_
          (string *__return_storage_ptr__,ConditionalExpr *this,bool ignore_top)

{
  Var *pVVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_140;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_110;
  string local_f0 [39];
  byte local_c9;
  ConditionalExpr *pCStack_c8;
  bool ignore_top_local;
  ConditionalExpr *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_b8;
  basic_string_view<char> local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_50;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_c9 = ignore_top;
  pCStack_c8 = this;
  this_local = (ConditionalExpr *)__return_storage_ptr__;
  (*(this->condition->super_IRNode)._vptr_IRNode[0x21])
            (local_f0,this->condition,(ulong)(ignore_top & 1));
  pVVar1 = (this->super_Expr).left;
  (*(pVVar1->super_IRNode)._vptr_IRNode[0x21])(&local_110,pVVar1,(ulong)(local_c9 & 1));
  pVVar1 = (this->super_Expr).right;
  (*(pVVar1->super_IRNode)._vptr_IRNode[0x21])(&local_140,pVVar1,(ulong)(local_c9 & 1));
  local_40 = "{0} ? {1}: {2}";
  local_48 = local_f0;
  local_50 = &local_110;
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_140;
  local_38 = __return_storage_ptr__;
  fmt::v7::
  make_args_checked<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char[15],char>
            (&local_98,(v7 *)"{0} ? {1}: {2}",(char (*) [15])local_48,local_50,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R9.values_);
  local_60 = &local_98;
  local_a8 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = &local_b8;
  local_30 = local_60;
  local_20 = local_60;
  local_10 = local_60;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xddd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_60);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_b8.field_1.values_;
  format_str.size_ = local_b8.desc_;
  format_str.data_ = (char *)local_a8.size_;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)local_a8.data_,format_str,args);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string(local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalExpr::handle_name(bool ignore_top) const {
    return ::format("{0} ? {1}: {2}", condition->handle_name(ignore_top),
                    left->handle_name(ignore_top), right->handle_name(ignore_top));
}